

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_decoder.cc
# Opt level: O2

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::StlDecoder::DecodeFromBuffer
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
           *__return_storage_ptr__,StlDecoder *this,DecoderBuffer *buffer)

{
  long lVar1;
  int iVar2;
  int att_id;
  uint32_t i;
  FaceIndex face_id;
  allocator<char> local_160 [8];
  float local_158;
  uint32_t face_count;
  uint16_t unused;
  TriangleSoupMeshBuilder builder;
  float local_118 [2];
  float local_110;
  float local_108 [2];
  float local_100;
  float data [48];
  
  lVar1 = buffer->pos_;
  iVar2 = strncmp(buffer->data_ + lVar1,"solid ",6);
  if (iVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"Currently only binary STL files are supported.",local_160);
    data[0] = -NAN;
    std::__cxx11::string::string((string *)(data + 2),(string *)&builder);
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (__return_storage_ptr__,(Status *)data);
    std::__cxx11::string::~string((string *)(data + 2));
    std::__cxx11::string::~string((string *)&builder);
  }
  else {
    buffer->pos_ = lVar1 + 0x50;
    DecoderBuffer::Decode(buffer,&face_count,4);
    builder.attribute_element_types_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    builder.mesh_._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
    super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
         (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
         (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0;
    builder.attribute_element_types_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    builder.attribute_element_types_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TriangleSoupMeshBuilder::Start(&builder,face_count);
    iVar2 = TriangleSoupMeshBuilder::AddAttribute(&builder,POSITION,'\x03',DT_FLOAT32);
    att_id = TriangleSoupMeshBuilder::AddAttribute(&builder,NORMAL,'\x03',DT_FLOAT32);
    for (face_id.value_ = 0; face_id.value_ < face_count; face_id.value_ = face_id.value_ + 1) {
      DecoderBuffer::Decode(buffer,data,0x30);
      DecoderBuffer::Decode(buffer,&unused,2);
      local_158 = data[2];
      TriangleSoupMeshBuilder::SetPerFaceAttributeValueForFace(&builder,att_id,face_id,local_160);
      local_160 = (allocator<char>  [8])data._12_8_;
      local_158 = data[5];
      local_108[0] = data[6];
      local_108[1] = data[7];
      local_100 = data[8];
      local_118[0] = data[9];
      local_118[1] = data[10];
      local_110 = data[0xb];
      TriangleSoupMeshBuilder::SetAttributeValuesForFace
                (&builder,iVar2,face_id,local_160,local_108,local_118);
    }
    TriangleSoupMeshBuilder::Finalize((TriangleSoupMeshBuilder *)data);
    (__return_storage_ptr__->status_).code_ = OK;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
    (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->value_)._M_t.
    super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
    super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)CONCAT44(data[1],data[0]);
    TriangleSoupMeshBuilder::~TriangleSoupMeshBuilder(&builder);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> StlDecoder::DecodeFromBuffer(
    DecoderBuffer *buffer) {
  if (!strncmp(buffer->data_head(), "solid ", 6)) {
    return Status(Status::IO_ERROR,
                  "Currently only binary STL files are supported.");
  }
  buffer->Advance(80);
  uint32_t face_count;
  buffer->Decode(&face_count, 4);

  TriangleSoupMeshBuilder builder;
  builder.Start(face_count);

  const int32_t pos_att_id =
      builder.AddAttribute(GeometryAttribute::POSITION, 3, DT_FLOAT32);
  const int32_t norm_att_id =
      builder.AddAttribute(GeometryAttribute::NORMAL, 3, DT_FLOAT32);

  for (uint32_t i = 0; i < face_count; i++) {
    float data[48];
    buffer->Decode(data, 48);
    uint16_t unused;
    buffer->Decode(&unused, 2);

    builder.SetPerFaceAttributeValueForFace(
        norm_att_id, draco::FaceIndex(i),
        draco::Vector3f(data[0], data[1], data[2]).data());

    builder.SetAttributeValuesForFace(
        pos_att_id, draco::FaceIndex(i),
        draco::Vector3f(data[3], data[4], data[5]).data(),
        draco::Vector3f(data[6], data[7], data[8]).data(),
        draco::Vector3f(data[9], data[10], data[11]).data());
  }

  std::unique_ptr<Mesh> mesh = builder.Finalize();
  return mesh;
}